

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

void PTCHelper(IClosestPointMapper *mapper,ON_Mesh *meshTo,ON_3fVector *vtFaceNormal,ON_3dPoint *vtx
              ,int i0,int i1,int i2,ON_3dPoint *tOut)

{
  ON_3dPoint *p;
  ON_3dPoint *pOVar1;
  long lVar2;
  undefined4 in_stack_0000000c;
  ON_3dPoint sample_tcs [3];
  ON_3dPoint local_130;
  ON_3dPoint *local_118;
  ON_3dPoint *local_110;
  ON_3dPoint local_108;
  ON_3dPoint local_f0;
  ON_3dPoint local_d8;
  ON_3dPoint local_c0;
  ON_3dPoint local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  double local_60;
  double dStack_58;
  double local_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_110 = (ON_3dPoint *)(vtFaceNormal + ((ulong)vtx & 0xffffffff) * 2);
  operator*(&local_d8,0.6,local_110);
  pOVar1 = (ON_3dPoint *)(vtFaceNormal + (ulong)(uint)i0 * 2);
  p = (ON_3dPoint *)(vtFaceNormal + (ulong)(uint)i1 * 2);
  local_118 = pOVar1;
  ON_3dPoint::operator+(&local_108,pOVar1,p);
  operator*(&local_130,0.2,&local_108);
  ON_3dPoint::operator+(&local_78,&local_d8,&local_130);
  operator*(&local_130,0.6,pOVar1);
  pOVar1 = local_110;
  ON_3dPoint::operator+(&local_f0,local_110,p);
  operator*(&local_108,0.2,&local_f0);
  ON_3dPoint::operator+(&local_d8,&local_130,&local_108);
  local_50 = local_d8.z;
  local_60 = local_d8.x;
  dStack_58 = local_d8.y;
  operator*(&local_130,0.6,p);
  ON_3dPoint::operator+(&local_f0,pOVar1,local_118);
  operator*(&local_108,0.2,&local_f0);
  ON_3dPoint::operator+(&local_d8,&local_130,&local_108);
  local_38 = local_d8.z;
  local_48 = local_d8.x;
  dStack_40 = local_d8.y;
  local_d8.z = ON_3dPoint::Origin.z;
  local_d8.x = ON_3dPoint::Origin.x;
  local_d8.y = ON_3dPoint::Origin.y;
  local_c0.x = ON_3dPoint::Origin.x;
  local_c0.y = ON_3dPoint::Origin.y;
  local_c0.z = ON_3dPoint::Origin.z;
  local_a8.x = ON_3dPoint::Origin.x;
  local_a8.y = ON_3dPoint::Origin.y;
  local_a8.z = ON_3dPoint::Origin.z;
  lVar2 = 0;
  do {
    (*mapper->_vptr_IClosestPointMapper[3])
              (mapper,(long)&local_78.x + lVar2,meshTo,(long)&local_d8.x + lVar2);
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  operator*(&local_108,2.0,&local_d8);
  ON_3dPoint::operator+(&local_90,&local_c0,&local_a8);
  operator*(&local_f0,0.5,&local_90);
  ON_3dPoint::operator-((ON_3dVector *)&local_130,&local_108,&local_f0);
  pOVar1 = (ON_3dPoint *)CONCAT44(in_stack_0000000c,i2);
  ON_3dPoint::operator=(pOVar1,(ON_3dVector *)&local_130);
  operator*(&local_108,2.0,&local_c0);
  ON_3dPoint::operator+(&local_90,&local_d8,&local_a8);
  operator*(&local_f0,0.5,&local_90);
  ON_3dPoint::operator-((ON_3dVector *)&local_130,&local_108,&local_f0);
  ON_3dPoint::operator=(pOVar1 + 1,(ON_3dVector *)&local_130);
  operator*(&local_108,2.0,&local_a8);
  ON_3dPoint::operator+(&local_90,&local_d8,&local_c0);
  operator*(&local_f0,0.5,&local_90);
  ON_3dPoint::operator-((ON_3dVector *)&local_130,&local_108,&local_f0);
  ON_3dPoint::operator=(pOVar1 + 2,(ON_3dVector *)&local_130);
  return;
}

Assistant:

static void PTCHelper(const IClosestPointMapper& mapper, const ON_Mesh & meshTo, const ON_3fVector & vtFaceNormal, const ON_3dPoint * vtx, int i0, int i1, int i2, ON_3dPoint * tOut)
{
	const double n = 3.0;
	const double m = (n + 1.0) / (n - 1.0);
	const double k = 1.0 / (n - 1.0);

	ON_3dPoint sample_points[3];

	sample_points[0] = n / (n + 2.0) * vtx[i0] + 1.0 / (n + 2.0) * (vtx[i1] + vtx[i2]);
	sample_points[1] = n / (n + 2.0) * vtx[i1] + 1.0 / (n + 2.0) * (vtx[i0] + vtx[i2]);
	sample_points[2] = n / (n + 2.0) * vtx[i2] + 1.0 / (n + 2.0) * (vtx[i0] + vtx[i1]);

	ON_3dPoint sample_tcs[3] = { ON_3dPoint::Origin, ON_3dPoint::Origin, ON_3dPoint::Origin };

	for (int i = 0; i < 3; i++)
	{
		mapper.ClosestPointTC(sample_points[i], vtFaceNormal, sample_tcs[i]);
	}

	tOut[0] = m * sample_tcs[0] - k * (sample_tcs[1] + sample_tcs[2]);
	tOut[1] = m * sample_tcs[1] - k * (sample_tcs[0] + sample_tcs[2]);
	tOut[2] = m * sample_tcs[2] - k * (sample_tcs[0] + sample_tcs[1]);
}